

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::popStackFrame(VirtualMachine *this)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  shared_ptr<runtime::StackFrame> outer;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  shared_ptr<runtime::StackFrame> currentFrame;
  VirtualMachine *this_local;
  
  currentFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<runtime::StackFrame>::shared_ptr
            ((shared_ptr<runtime::StackFrame> *)local_20,&this->stackFrame);
  bVar1 = std::operator==((shared_ptr<runtime::StackFrame> *)local_20,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No current stack frame found!",&local_41);
    panic(this,&local_40);
  }
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<runtime::StackFrame>::shared_ptr
            ((shared_ptr<runtime::StackFrame> *)local_68,&peVar2->outer);
  bVar1 = std::operator==((shared_ptr<runtime::StackFrame> *)local_68,(nullptr_t)0x0);
  if (!bVar1) {
    std::shared_ptr<runtime::StackFrame>::operator=
              (&this->stackFrame,(shared_ptr<runtime::StackFrame> *)local_68);
    std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)local_68);
    std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)local_20);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"No outer stack frame found!",&local_89);
  panic(this,&local_88);
}

Assistant:

void runtime::VirtualMachine::popStackFrame() {
  auto currentFrame = this->stackFrame;

  if (currentFrame == nullptr) {
    this->panic("No current stack frame found!");
    return;
  }

  auto outer = currentFrame->outer;

  if (outer == nullptr) {
    this->panic("No outer stack frame found!");
    return;
  }

  this->stackFrame = outer;
}